

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  Parse *pParse_00;
  WhereInfo *p_00;
  long lVar1;
  sqlite3 *db_00;
  long lVar2;
  Table *pTab_00;
  i16 iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int addr_00;
  int *piVar7;
  long lVar8;
  VdbeOp *pVVar9;
  undefined8 *in_RDI;
  Index *pPk;
  int x;
  IndexedExpr *p;
  Table *pTab;
  SrcItem *pTabItem;
  Index *pIdx_1;
  VdbeOp *pLastOp;
  VdbeOp *pOp;
  int last;
  int k;
  int iDb;
  Index *pIx;
  int n_1;
  int m;
  SrcItem *pSrc;
  int ws;
  int bEarlyOut;
  int j_1;
  InLoop *pIn;
  int op;
  int j;
  int r1;
  int n;
  Index *pIdx;
  int addrSeek;
  WhereRightJoin *pRJ;
  int addr;
  int nRJ;
  int iEnd;
  sqlite3 *db;
  SrcList *pTabList;
  WhereLoop *pLoop;
  WhereLevel *pLevel;
  int i;
  Vdbe *v;
  Parse *pParse;
  WhereInfo *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  WhereInfo *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  Vdbe *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int iVar10;
  IndexedExpr *local_e8;
  Index *local_d0;
  VdbeOp *local_c0;
  int in_stack_ffffffffffffff54;
  SrcList *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  Parse *in_stack_ffffffffffffff68;
  int local_84;
  int *local_80;
  int local_74;
  WhereLevel *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  char cVar11;
  int iVar12;
  undefined8 *local_28;
  uint local_1c;
  
  pParse_00 = (Parse *)*in_RDI;
  p_00 = (WhereInfo *)pParse_00->pVdbe;
  lVar1 = in_RDI[1];
  db_00 = pParse_00->db;
  iVar4 = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
  iVar12 = 0;
  local_1c = (uint)*(byte *)(in_RDI + 8);
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    in_stack_ffffffffffffffb4 = -0x55555556;
    piVar7 = (int *)(in_RDI + (long)(int)local_1c * 0xe + 0x6b);
    if (*(long *)(piVar7 + 0xe) != 0) {
      in_stack_ffffffffffffffa8 = *(WhereLevel **)(piVar7 + 0xe);
      sqlite3VdbeResolveLabel
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      piVar7[6] = 0;
      iVar5 = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
      in_stack_ffffffffffffffa8->addrNxt = iVar5;
      sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                        in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                        (int)in_stack_fffffffffffffef8);
      iVar12 = iVar12 + 1;
    }
    lVar2 = *(long *)(piVar7 + 0x18);
    if (*(char *)((long)piVar7 + 0x41) == -0x45) {
      if (piVar7[6] != 0) {
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      }
    }
    else {
      iVar5 = 0;
      if (((((*(char *)((long)in_RDI + 0x43) == '\x02') && (local_1c == *(byte *)(in_RDI + 8) - 1))
           && ((*(uint *)(lVar2 + 0x30) & 0x200) != 0)) &&
          (((*(ushort *)(*(long *)(lVar2 + 0x20) + 99) >> 7 & 1) != 0 &&
           (uVar6 = (uint)*(ushort *)(lVar2 + 0x1e), uVar6 != 0)))) &&
         (0x23 < *(short *)(*(long *)(*(long *)(lVar2 + 0x20) + 0x10) + (long)(int)uVar6 * 2))) {
        local_74 = 0;
        while( true ) {
          iVar5 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          if ((int)uVar6 <= local_74) break;
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                            in_stack_ffffffffffffff00,iVar5,(int)in_stack_fffffffffffffef8);
          local_74 = local_74 + 1;
        }
        pParse_00->nMem = uVar6 + 1 + pParse_00->nMem;
        iVar5 = sqlite3VdbeAddOp4Int
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                           in_stack_ffffffffffffff00,iVar5,(int)in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef4);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8,0);
      }
      if (piVar7[6] != 0) {
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      }
      sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                        in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                        (int)in_stack_fffffffffffffef8);
      sqlite3VdbeChangeP5((Vdbe *)p_00,(ushort)*(byte *)((long)piVar7 + 0x43));
      if (piVar7[9] != 0) {
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8,0);
      }
      if (iVar5 != 0) {
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      }
    }
    if (((*(uint *)(lVar2 + 0x30) & 0x800) != 0) && (0 < piVar7[0x14])) {
      sqlite3VdbeResolveLabel
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      local_84 = piVar7[0x14];
      local_80 = (int *)(*(long *)(piVar7 + 0x16) + (long)(local_84 + -1) * 0x14);
      for (; 0 < local_84; local_84 = local_84 + -1) {
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        if ((char)local_80[4] != -0x45) {
          if (local_80[3] != 0) {
            uVar6 = in_stack_ffffffffffffff04 & 0xffffff;
            if ((*(uint *)(lVar2 + 0x30) & 0x400) == 0) {
              uVar6 = CONCAT13((*(uint *)(lVar2 + 0x30) & 0x40000) != 0,
                               (int3)in_stack_ffffffffffffff04);
            }
            in_stack_ffffffffffffff04 = uVar6;
            uVar6 = in_stack_ffffffffffffff04 >> 0x18;
            if (*piVar7 != 0) {
              in_stack_ffffffffffffff00 = *local_80;
              in_stack_fffffffffffffef8 = p_00;
              sqlite3VdbeCurrentAddr((Vdbe *)p_00);
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ),(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                                (int)in_stack_fffffffffffffee8,0);
            }
            if (uVar6 != 0) {
              in_stack_fffffffffffffef4 = piVar7[2];
              in_stack_fffffffffffffee8 = p_00;
              sqlite3VdbeCurrentAddr((Vdbe *)p_00);
              sqlite3VdbeAddOp4Int
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                         in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                         (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
              sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0),
                                  (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
            }
          }
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                            (int)in_stack_fffffffffffffee8,0);
        }
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        local_80 = local_80 + -5;
      }
    }
    sqlite3VdbeResolveLabel
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    if (*(long *)(piVar7 + 0xe) != 0) {
      sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                        in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                        (int)in_stack_fffffffffffffef8);
    }
    if (piVar7[5] != 0) {
      sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    }
    if (piVar7[0xc] != 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                        (int)in_stack_fffffffffffffee8,0);
    }
    if (*piVar7 != 0) {
      uVar6 = *(uint *)(lVar2 + 0x30);
      in_stack_ffffffffffffffb4 =
           sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                             (int)in_stack_fffffffffffffee8);
      if ((uVar6 & 0x40) == 0) {
        in_stack_ffffffffffffff68 = (Parse *)(lVar1 + 8 + (ulong)*(byte *)(piVar7 + 0x10) * 0x48);
        if ((*(ushort *)((long)&in_stack_ffffffffffffff68->rc + 1) >> 6 & 1) != 0) {
          in_stack_ffffffffffffff64 =
               (int)*(short *)((long)&in_stack_ffffffffffffff68->pVdbe->rc + 2);
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                            in_stack_ffffffffffffff00,
                            (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                            (int)in_stack_fffffffffffffef8);
        }
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8);
      }
      if (((uVar6 & 0x200) != 0) || (((uVar6 & 0x2000) != 0 && (*(long *)(piVar7 + 0x14) != 0)))) {
        if ((uVar6 & 0x2000) != 0) {
          in_stack_ffffffffffffff58 = *(SrcList **)(piVar7 + 0x14);
          in_stack_ffffffffffffff54 =
               sqlite3SchemaToIndex(db_00,(Schema *)in_stack_ffffffffffffff58->a[0].u1.pFuncArg);
          sqlite3VdbeAddOp3(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                            in_stack_ffffffffffffff00,
                            (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                            (int)in_stack_fffffffffffffef8);
          sqlite3VdbeSetP4KeyInfo
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     (Index *)in_stack_fffffffffffffef8);
        }
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (int)in_stack_fffffffffffffee8);
      }
      iVar5 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (*(char *)((long)piVar7 + 0x41) == 'C') {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          iVar5,(int)in_stack_fffffffffffffee8,0);
      }
      else {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),iVar5)
        ;
      }
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    }
  }
  local_28 = in_RDI + 0x6b;
  for (local_1c = 0; (int)local_1c < (int)(uint)*(byte *)(in_RDI + 8); local_1c = local_1c + 1) {
    local_d0 = (Index *)0x0;
    lVar8 = lVar1 + 8 + (ulong)*(byte *)(local_28 + 8) * 0x48;
    pTab_00 = *(Table **)(lVar8 + 0x10);
    lVar2 = local_28[0xc];
    if (local_28[7] == 0) {
      if ((*(ushort *)(lVar8 + 0x19) >> 6 & 1) == 0) {
        if ((*(uint *)(lVar2 + 0x30) & 0x240) == 0) {
          if ((*(uint *)(lVar2 + 0x30) & 0x2000) != 0) {
            local_d0 = (Index *)local_28[10];
          }
        }
        else {
          local_d0 = *(Index **)(lVar2 + 0x20);
        }
        if ((local_d0 != (Index *)0x0) && (db_00->mallocFailed == '\0')) {
          iVar5 = iVar4;
          if ((*(char *)((long)in_RDI + 0x42) != '\0') && ((local_d0->pTable->tabFlags & 0x80) == 0)
             ) {
            iVar5 = *(int *)((long)in_RDI + 0x4c);
          }
          if ((*(ushort *)&local_d0->field_0x63 >> 0xc & 1) != 0) {
            for (local_e8 = pParse_00->pIdxEpr; local_e8 != (IndexedExpr *)0x0;
                local_e8 = local_e8->pIENext) {
              if (local_e8->iIdxCur == *(int *)(local_28 + 1)) {
                local_e8->iDataCur = -1;
                local_e8->iIdxCur = -1;
              }
            }
          }
          addr_00 = *(int *)(local_28 + 4) + 1;
          local_c0 = sqlite3VdbeGetOp((Vdbe *)p_00,addr_00);
          pVVar9 = local_c0 + (iVar5 - addr_00);
          do {
            if (local_c0->p1 == *(int *)((long)local_28 + 4)) {
              if (local_c0->opcode == '^') {
                iVar10 = local_c0->p2;
                if ((pTab_00->tabFlags & 0x80) == 0) {
                  iVar3 = sqlite3StorageColumnToTable(pTab_00,(i16)iVar10);
                }
                else {
                  in_stack_ffffffffffffff08 = (Vdbe *)sqlite3PrimaryKeyIndex(pTab_00);
                  iVar3 = *(i16 *)((long)in_stack_ffffffffffffff08->ppVPrev + (long)iVar10 * 2);
                }
                iVar3 = sqlite3TableColumnToIndex(local_d0,iVar3);
                in_stack_ffffffffffffff14 = (int)iVar3;
                if (in_stack_ffffffffffffff14 < 0) {
                  if ((*(uint *)(lVar2 + 0x30) & 0x4000040) != 0) {
                    if ((*(uint *)(lVar2 + 0x30) & 0x40) == 0) {
                      *(uint *)(lVar2 + 0x30) = *(uint *)(lVar2 + 0x30) & 0xfbffffff;
                      sqlite3WhereAddExplainText
                                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                                 in_stack_ffffffffffffff58,
                                 (WhereLevel *)CONCAT44(in_stack_ffffffffffffff54,addr_00),
                                 (u16)((uint)iVar5 >> 0x10));
                    }
                    else {
                      sqlite3ErrorMsg(pParse_00,"internal query planner error");
                      pParse_00->rc = 2;
                    }
                  }
                }
                else {
                  local_c0->p2 = in_stack_ffffffffffffff14;
                  local_c0->p1 = *(int *)(local_28 + 1);
                }
              }
              else if (local_c0->opcode == 0x87) {
                local_c0->p1 = *(int *)(local_28 + 1);
                local_c0->opcode = 0x8e;
              }
              else if (local_c0->opcode == '\x14') {
                local_c0->p1 = *(int *)(local_28 + 1);
              }
            }
            local_c0 = local_c0 + 1;
          } while (local_c0 < pVVar9);
        }
      }
      else {
        translateColumnToCopy
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08,
                   in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
      }
    }
    else {
      sqlite3WhereRightJoinLoop
                ((WhereInfo *)CONCAT44(iVar4,iVar12),in_stack_ffffffffffffffb4,
                 in_stack_ffffffffffffffa8);
    }
    local_28 = local_28 + 0xe;
  }
  sqlite3VdbeResolveLabel
            ((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  cVar11 = (char)iVar12;
  pParse_00->nQueryLoop = (LogEst)*(undefined4 *)(in_RDI + 7);
  whereInfoFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                in_stack_fffffffffffffef8);
  pParse_00->withinRJSubrtn = pParse_00->withinRJSubrtn - cVar11;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        SrcItem *pSrc = &pTabList->a[pLevel->iFrom];
        assert( pLevel->iTabCur==pSrc->iCursor );
        if( pSrc->fg.viaCoroutine ){
          int m, n;
          assert( pSrc->fg.isSubquery );
          n = pSrc->u4.pSubq->regResult;
          assert( pSrc->pSTab!=0 );
          m = pSrc->pSTab->nCol;
          sqlite3VdbeAddOp3(v, OP_Null, 0, n, n+m-1);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pSTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pSTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      assert( pTabItem->fg.isSubquery );
      assert( pTabItem->u4.pSubq->regResult>=0 );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->u4.pSubq->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxEpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x200 ){
              sqlite3DebugPrintf("Disable pParse->pIdxEpr term {%d,%d}\n",
                                  p->iIdxCur, p->iIdxCol);
              if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(p->pExpr);
            }
#endif
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE cursor %d->%d in opcode range %d..%d\n",
                pLevel->iTabCur, pLevel->iIdxCur, k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else if( pLoop->wsFlags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
            if( pLoop->wsFlags & WHERE_IDX_ONLY ){
              /* An error. pLoop is supposed to be a covering index loop,
              ** and yet the VM code refers to a column of the table that
              ** is not part of the index.  */
              sqlite3ErrorMsg(pParse, "internal query planner error");
              pParse->rc = SQLITE_INTERNAL;
            }else{
              /* The WHERE_EXPRIDX flag is set by the planner when it is likely
              ** that pLoop is a covering index loop, but it is not possible
              ** to be 100% sure. In this case, any OP_Explain opcode
              ** corresponding to this loop describes the index as a "COVERING
              ** INDEX". But, pOp proves that pLoop is not actually a covering
              ** index loop. So clear the WHERE_EXPRIDX flag and rewrite the
              ** text that accompanies the OP_Explain opcode, if any.  */
              pLoop->wsFlags &= ~WHERE_EXPRIDX;
              sqlite3WhereAddExplainText(pParse,
                  pLevel->addrBody-1,
                  pTabList,
                  pLevel,
                  pWInfo->wctrlFlags
              );
            }
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}